

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  function<void_(const_std::basic_string_view<char,_std::char_traits<char>_>_&)> local_28;
  
  local_28.super__Function_base._M_functor._8_8_ = 0;
  local_28.super__Function_base._M_functor._M_unused._M_object = DebugCallback;
  local_28._M_invoker =
       std::
       _Function_handler<void_(const_std::basic_string_view<char,_std::char_traits<char>_>_&),_void_(*)(const_std::basic_string_view<char,_std::char_traits<char>_>_&)>
       ::_M_invoke;
  local_28.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_std::basic_string_view<char,_std::char_traits<char>_>_&),_void_(*)(const_std::basic_string_view<char,_std::char_traits<char>_>_&)>
       ::_M_manager;
  KV::setDebugCallback(&local_28);
  if (local_28.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_28.super__Function_base._M_manager)
              ((_Any_data *)&local_28,(_Any_data *)&local_28,__destroy_functor);
  }
  SerializeTest();
  ParseFileTest();
  ParseStringTest();
  ParseErrorTest();
  return 0;
}

Assistant:

int main()
{
#ifdef _WIN32
	SetConsoleOutputCP( CP_UTF8 );
#endif

	KV::setDebugCallback( &DebugCallback );

	SerializeTest();
	ParseFileTest();
	ParseStringTest();
	ParseErrorTest();

	return 0;
}